

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flicker_remover.cxx
# Opt level: O1

void __thiscall FlickerRemover::~FlickerRemover(FlickerRemover *this)

{
  ~FlickerRemover(this);
  operator_delete(this,0x1b0);
  return;
}

Assistant:

FlickerRemover::~FlickerRemover()
{
    clear();
}